

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O0

void __thiscall QPauseAnimation::QPauseAnimation(QPauseAnimation *this,int msecs,QObject *parent)

{
  QAbstractAnimationPrivate *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  operator_new(0xa8);
  QPauseAnimationPrivate::QPauseAnimationPrivate
            ((QPauseAnimationPrivate *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
            );
  QAbstractAnimation::QAbstractAnimation
            ((QAbstractAnimation *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             (QObject *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *in_RDI = &PTR_metaObject_00be9b88;
  setDuration((QPauseAnimation *)in_RDX,in_stack_ffffffffffffffe4);
  return;
}

Assistant:

QPauseAnimation::QPauseAnimation(int msecs, QObject *parent) : QAbstractAnimation(*new QPauseAnimationPrivate, parent)
{
    setDuration(msecs);
}